

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O2

void google::protobuf::internal::LogIndexOutOfBoundsAndAbort(int index,int size)

{
  LogMessage *pLVar1;
  LogMessage LStack_28;
  
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.cc"
             ,0x25);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&LStack_28,(char (*) [8])"index: ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,index);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [9])", size: ")
  ;
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,size);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

[[noreturn]] void LogIndexOutOfBoundsAndAbort(int index, int size) {
  ABSL_LOG(FATAL) << "index: " << index << ", size: " << size;
}